

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O0

void __thiscall FIntermissionAction::FIntermissionAction(FIntermissionAction *this)

{
  FIntermissionAction *this_local;
  
  this->_vptr_FIntermissionAction = (_func_int **)&PTR__FIntermissionAction_009ec7e0;
  FString::FString(&this->mMusic);
  FString::FString(&this->mBackground);
  FString::FString(&this->mPalette);
  FString::FString(&this->mSound);
  TArray<FIntermissionPatch,_FIntermissionPatch>::TArray(&this->mOverlays);
  this->mSize = 0x60;
  this->mClass = DIntermissionScreen::RegistrationInfo.MyClass;
  this->mDuration = 0;
  this->mCdTrack = 0;
  this->mCdId = 0;
  this->mMusicOrder = 0;
  this->mFlatfill = false;
  this->mMusicLooping = true;
  return;
}

Assistant:

FIntermissionAction::FIntermissionAction()
{
	mSize = sizeof(FIntermissionAction);
	mClass = RUNTIME_CLASS(DIntermissionScreen);
	mMusicOrder =
	mCdId = 
	mCdTrack = 
	mDuration = 0;
	mFlatfill = false;
	mMusicLooping = true;
}